

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_resume_data.cpp
# Opt level: O0

add_torrent_params *
libtorrent::read_resume_data
          (add_torrent_params *__return_storage_ptr__,bdecode_node *rd,error_code *ec,
          int piece_limit)

{
  sha1_hash h1;
  sha256_hash h2;
  ulong uVar1;
  bool bVar2;
  byte bVar3;
  type_t tVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int64_t iVar8;
  size_type sVar9;
  size_type sVar10;
  const_pointer pvVar11;
  element_type *peVar12;
  reference this;
  vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>> *this_00;
  const_reference pvVar13;
  reference pvVar14;
  int64_t iVar15;
  mapped_type *this_01;
  strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *psVar16;
  reference url_00;
  unsigned_long uVar17;
  uchar *puVar18;
  reference pvVar19;
  mapped_type *this_02;
  char *pcVar20;
  bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void> f;
  char **in;
  char **in_00;
  char **in_01;
  char **in_02;
  string_view sVar21;
  span<const_char> data;
  basic_string_view<char,_std::char_traits<char>_> bVar22;
  bool local_db9;
  string_view local_d88;
  undefined1 local_d78 [8];
  bdecode_node bitmask;
  string_view local_d30;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_d1c;
  undefined1 local_d18 [4];
  piece_index_t piece;
  bdecode_node e;
  undefined1 auStack_cd0 [4];
  int i_11;
  undefined1 local_cc0 [8];
  bdecode_node unfinished_entry;
  int local_c64;
  char *pcStack_c60;
  int i_10;
  char *ptr_3;
  undefined1 local_c48 [8];
  bdecode_node peers_entry_3;
  int local_bec;
  char *pcStack_be8;
  int i_9;
  char *ptr_2;
  undefined1 local_bd0 [8];
  bdecode_node peers_entry_2;
  int local_b74;
  char *pcStack_b70;
  int i_8;
  char *ptr_1;
  undefined1 local_b58 [8];
  bdecode_node peers_entry_1;
  int local_afc;
  char *pcStack_af8;
  int i_7;
  char *ptr;
  undefined1 local_ae0 [8];
  bdecode_node peers_entry;
  int v4_size;
  int v6_size;
  size_t i_6;
  char *prio_str;
  undefined1 local_a70 [8];
  bdecode_node piece_priority;
  string_view str_3;
  undefined1 local_a10 [8];
  bdecode_node verified_1;
  string_view str_2;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_9b0;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_9ac;
  byte local_9a5;
  piece_index_t i_5;
  bool any_verified;
  int pieces_len;
  char *pieces_str;
  undefined1 local_988 [8];
  bdecode_node pieces;
  undefined1 local_938 [8];
  string_view url;
  int i_4;
  string_view local_918;
  undefined1 local_908 [8];
  bdecode_node url_list;
  string_view local_8c0;
  string_view local_8b0;
  int local_89c;
  undefined1 local_898 [4];
  int j_2;
  bdecode_node tier_list;
  int i_3;
  int tier;
  string_view local_848;
  undefined1 local_838 [8];
  bdecode_node trackers;
  strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> local_7e9;
  size_type local_7e8;
  size_t idx;
  int i_2;
  int num_files;
  undefined1 local_7c8 [8];
  bdecode_node file_priority;
  string_view local_778;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_764;
  string_view local_760;
  undefined1 local_750 [8];
  string_view new_filename;
  undefined1 auStack_738 [4];
  int i_1;
  undefined1 local_728 [8];
  bdecode_node mapped_files;
  string_view local_6d8;
  string_view local_6c8;
  undefined8 local_6b8;
  undefined8 local_6b0;
  undefined8 local_6a8;
  undefined8 local_6a0;
  undefined8 local_698;
  undefined8 local_690;
  undefined8 local_688;
  undefined8 local_680;
  undefined8 local_678;
  undefined8 local_670;
  undefined8 local_668;
  undefined8 local_660;
  undefined8 local_658;
  string_view local_650;
  string_view local_640;
  string_view local_630;
  string_view local_620;
  string_view local_610;
  string_view local_600;
  string_view local_5f0;
  string_view local_5e0;
  string_view local_5d0;
  string_view local_5c0;
  string_view local_5b0;
  string_view local_5a0;
  string_view local_590;
  string_view local_580;
  string_view local_570;
  int local_55c;
  const_pointer local_558;
  ulong local_550;
  size_t j_1;
  undefined1 local_540 [8];
  string_view str_1;
  undefined1 local_520 [8];
  bdecode_node mask;
  const_pointer local_4d8;
  ulong local_4d0;
  size_t j;
  undefined1 local_4c0 [8];
  string_view str;
  undefined1 local_4a0 [8];
  bdecode_node verified;
  char *local_458;
  undefined1 local_450 [8];
  string_view hashes;
  string_view local_430;
  undefined1 local_420 [8];
  bdecode_node dh;
  bdecode_node de;
  undefined1 auStack_398 [4];
  int i;
  undefined1 local_388 [8];
  bdecode_node trees;
  undefined8 uStack_33c;
  uint local_334;
  string_view local_330;
  string_view local_320;
  string_view local_310;
  string_view local_300;
  string_view local_2f0;
  string_view local_2e0;
  string_view local_2d0;
  undefined1 local_2c0 [8];
  error_code err;
  shared_ptr<libtorrent::torrent_info> ti;
  hasher256 local_290;
  sha256_hash local_288;
  span<const_char> local_268;
  hasher local_258;
  sha1_hash local_250;
  undefined1 local_23c [8];
  info_hash_t resume_ih;
  undefined1 local_1f8 [8];
  bdecode_node info;
  string_view local_1a8;
  string_view local_198;
  string_view local_188;
  string_view local_178;
  undefined1 local_168 [8];
  string_view info_hash2;
  string_view local_148;
  undefined1 local_138 [8];
  string_view info_hash;
  int64_t file_version;
  string_view local_100;
  string_view local_f0;
  basic_string_view<char,_std::char_traits<char>_> local_e0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_d0;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_b0;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  string_view local_80;
  undefined1 local_70 [8];
  bdecode_node alloc;
  int piece_limit_local;
  error_code *ec_local;
  bdecode_node *rd_local;
  add_torrent_params *ret;
  
  add_torrent_params::add_torrent_params(__return_storage_ptr__);
  tVar4 = bdecode_node::type(rd);
  if (tVar4 != dict_t) {
    boost::system::error_code::operator=(ec,not_a_dictionary);
    return __return_storage_ptr__;
  }
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_80,"allocation")
  ;
  bdecode_node::dict_find_string((bdecode_node *)local_70,rd,local_80);
  bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_70);
  if (bVar2) {
    local_a0 = bdecode_node::string_value((bdecode_node *)local_70);
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b0,"allocate")
    ;
    bVar2 = ::std::operator==(local_a0,local_b0);
    local_db9 = true;
    if (!bVar2) {
      local_c0 = bdecode_node::string_value((bdecode_node *)local_70);
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d0,"full");
      local_db9 = ::std::operator==(local_c0,local_d0);
    }
    __return_storage_ptr__->storage_mode = (uint)(local_db9 == false);
  }
  bdecode_node::~bdecode_node((bdecode_node *)local_70);
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_f0,"file-format");
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_100);
  local_e0 = bdecode_node::dict_find_string_value(rd,local_f0,local_100);
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&file_version,
             "libtorrent resume file");
  bVar2 = ::std::operator!=(local_e0,_file_version);
  if (bVar2) {
    boost::system::error_code::operator=(ec,invalid_file_tag);
    return __return_storage_ptr__;
  }
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&info_hash._M_str,"file-version");
  iVar8 = bdecode_node::dict_find_int_value(rd,stack0xfffffffffffffed8,1);
  if ((iVar8 != 1) && (iVar8 != 2)) {
    boost::system::error_code::operator=(ec,invalid_file_tag);
    return __return_storage_ptr__;
  }
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_148,"info-hash")
  ;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&info_hash2._M_str);
  sVar21 = bdecode_node::dict_find_string_value(rd,local_148,stack0xfffffffffffffea8);
  info_hash._M_len = (size_t)sVar21._M_str;
  local_138 = (undefined1  [8])sVar21._M_len;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_178,"info-hash2");
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_188);
  sVar21 = bdecode_node::dict_find_string_value(rd,local_178,local_188);
  info_hash2._M_len = (size_t)sVar21._M_str;
  local_168 = (undefined1  [8])sVar21._M_len;
  sVar9 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_138);
  sVar10 = digest32<160L>::size();
  if (sVar9 != sVar10) {
    sVar9 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_168);
    sVar10 = digest32<256L>::size();
    if (sVar9 != sVar10) {
      boost::system::error_code::operator=(ec,missing_info_hash);
      return __return_storage_ptr__;
    }
  }
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1a8,"name");
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&info.m_size);
  local_198 = bdecode_node::dict_find_string_value(rd,local_1a8,stack0xfffffffffffffe48);
  ::std::__cxx11::string::operator=((string *)&__return_storage_ptr__->name,&local_198);
  sVar9 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_138);
  if (sVar9 == 0x14) {
    pvVar11 = ::std::basic_string_view<char,_std::char_traits<char>_>::data
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_138);
    digest32<160L>::assign(&(__return_storage_ptr__->info_hashes).v1,pvVar11);
  }
  sVar9 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_168);
  if (sVar9 == 0x20) {
    pvVar11 = ::std::basic_string_view<char,_std::char_traits<char>_>::data
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_168);
    digest32<256L>::assign(&(__return_storage_ptr__->info_hashes).v2,pvVar11);
  }
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             (resume_ih.v2.m_number._M_elems + 6),"info");
  bdecode_node::dict_find_dict((bdecode_node *)local_1f8,rd,stack0xfffffffffffffdf8);
  bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_1f8);
  if (!bVar2) goto LAB_0053a265;
  local_268 = bdecode_node::data_section((bdecode_node *)local_1f8);
  lcrypto::hasher::hasher(&local_258,local_268);
  lcrypto::hasher::final(&local_250,&local_258);
  data = bdecode_node::data_section((bdecode_node *)local_1f8);
  lcrypto::hasher256::hasher256(&local_290,data);
  lcrypto::hasher256::final(&local_288,&local_290);
  h1.m_number._M_elems[2] = local_250.m_number._M_elems[2];
  h1.m_number._M_elems[3] = local_250.m_number._M_elems[3];
  h1.m_number._M_elems[0] = local_250.m_number._M_elems[0];
  h1.m_number._M_elems[1] = local_250.m_number._M_elems[1];
  h1.m_number._M_elems[4] = local_250.m_number._M_elems[4];
  h2.m_number._M_elems[2] = local_288.m_number._M_elems[2];
  h2.m_number._M_elems[3] = local_288.m_number._M_elems[3];
  h2.m_number._M_elems[0] = local_288.m_number._M_elems[0];
  h2.m_number._M_elems[1] = local_288.m_number._M_elems[1];
  h2.m_number._M_elems[4] = local_288.m_number._M_elems[4];
  h2.m_number._M_elems[5] = local_288.m_number._M_elems[5];
  h2.m_number._M_elems[6] = local_288.m_number._M_elems[6];
  h2.m_number._M_elems[7] = local_288.m_number._M_elems[7];
  info_hash_t::info_hash_t((info_hash_t *)local_23c,h1,h2);
  lcrypto::hasher256::~hasher256(&local_290);
  lcrypto::hasher::~hasher(&local_258);
  bVar2 = info_hash_t::has_v1(&__return_storage_ptr__->info_hashes);
  if (bVar2) {
    bVar2 = digest32<160L>::operator==
                      ((digest32<160L> *)local_23c,&(__return_storage_ptr__->info_hashes).v1);
    if (bVar2) goto LAB_00539f13;
LAB_0053a255:
    boost::system::error_code::operator=(ec,mismatching_info_hash);
  }
  else {
LAB_00539f13:
    bVar2 = info_hash_t::has_v2(&__return_storage_ptr__->info_hashes);
    if (bVar2) {
      bVar2 = digest32<256L>::operator==
                        ((digest32<256L> *)(resume_ih.v1.m_number._M_elems + 3),
                         &(__return_storage_ptr__->info_hashes).v2);
      if (!bVar2) goto LAB_0053a255;
    }
    ::std::make_shared<libtorrent::torrent_info,libtorrent::info_hash_t_const&>
              ((info_hash_t *)&err.cat_);
    boost::system::error_code::error_code((error_code *)local_2c0);
    peVar12 = ::std::
              __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&err.cat_);
    bVar2 = torrent_info::parse_info_section
                      (peVar12,(bdecode_node *)local_1f8,(error_code *)local_2c0,piece_limit);
    if (bVar2) {
      peVar12 = ::std::
                __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&err.cat_);
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_2d0,"creation date");
      iVar15 = bdecode_node::dict_find_int_value(rd,local_2d0,0);
      torrent_info::internal_set_creation_date(peVar12,iVar15);
      peVar12 = ::std::
                __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&err.cat_);
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_2f0,"created by");
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_300,"");
      local_2e0 = bdecode_node::dict_find_string_value(rd,local_2f0,local_300);
      torrent_info::internal_set_creator(peVar12,local_2e0);
      peVar12 = ::std::
                __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&err.cat_);
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_320,"comment");
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_330,"");
      local_310 = bdecode_node::dict_find_string_value(rd,local_320,local_330);
      torrent_info::internal_set_comment(peVar12,local_310);
    }
    else {
      ec->val_ = local_2c0._0_4_;
      ec->failed_ = (bool)local_2c0[4];
      *(undefined3 *)&ec->field_0x5 = local_2c0._5_3_;
      ec->cat_ = (error_category *)err._0_8_;
    }
    ::std::shared_ptr<libtorrent::torrent_info>::operator=
              (&__return_storage_ptr__->ti,(shared_ptr<libtorrent::torrent_info> *)&err.cat_);
    ::std::shared_ptr<libtorrent::torrent_info>::~shared_ptr
              ((shared_ptr<libtorrent::torrent_info> *)&err.cat_);
  }
LAB_0053a265:
  info_hash_t::get_best((sha1_hash *)&trees.field_0x3c,&__return_storage_ptr__->info_hashes);
  (__return_storage_ptr__->info_hash).m_number._M_elems[4] = local_334;
  *(undefined8 *)(__return_storage_ptr__->info_hash).m_number._M_elems = stack0xfffffffffffffcbc;
  *(undefined8 *)((__return_storage_ptr__->info_hash).m_number._M_elems + 2) = uStack_33c;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_398,"trees");
  bdecode_node::dict_find_list((bdecode_node *)local_388,rd,_auStack_398);
  bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_388);
  if (bVar2) {
    iVar7 = bdecode_node::list_size((bdecode_node *)local_388);
    aux::
    container_wrapper<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>,std::allocator<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>>>
    ::reserve<int,void>((container_wrapper<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>,std::allocator<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>>>
                         *)&__return_storage_ptr__->merkle_trees,iVar7);
    iVar7 = bdecode_node::list_size((bdecode_node *)local_388);
    aux::
    container_wrapper<libtorrent::bitfield,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::bitfield,std::allocator<libtorrent::bitfield>>>
    ::reserve<int,void>((container_wrapper<libtorrent::bitfield,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::bitfield,std::allocator<libtorrent::bitfield>>>
                         *)&__return_storage_ptr__->verified_leaf_hashes,iVar7);
    de._60_4_ = 0;
    while( true ) {
      iVar7 = bdecode_node::list_size((bdecode_node *)local_388);
      if (iVar7 <= (int)de._60_4_) break;
      bdecode_node::list_at((bdecode_node *)&dh.m_size,(bdecode_node *)local_388,de._60_4_);
      tVar4 = bdecode_node::type((bdecode_node *)&dh.m_size);
      if (tVar4 == dict_t) {
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_430,"hashes");
        bdecode_node::dict_find_string
                  ((bdecode_node *)local_420,(bdecode_node *)&dh.m_size,local_430);
        bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_420);
        if (bVar2) {
          iVar7 = bdecode_node::string_length((bdecode_node *)local_420);
          if (iVar7 % 0x20 != 0) goto LAB_0053a469;
          ::std::
          vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
          ::emplace_back<>(&(__return_storage_ptr__->merkle_trees).
                            super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                          );
          this = ::std::
                 vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                 ::back(&(__return_storage_ptr__->merkle_trees).
                         super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                       );
          sVar21 = bdecode_node::string_value((bdecode_node *)local_420);
          hashes._M_str = (char *)sVar21._M_len;
          sVar9 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)&hashes._M_str);
          ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
          reserve(this,sVar9 >> 5);
          sVar21 = bdecode_node::string_value((bdecode_node *)local_420);
          bVar22._M_str = local_458;
          bVar22._M_len = verified._56_8_;
          while( true ) {
            hashes._M_len = (size_t)sVar21._M_str;
            local_450 = (undefined1  [8])sVar21._M_len;
            local_458 = bVar22._M_str;
            verified._56_8_ = bVar22._M_len;
            bVar2 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                              ((basic_string_view<char,_std::char_traits<char>_> *)local_450);
            if (((bVar2 ^ 0xffU) & 1) == 0) break;
            this_00 = (vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>
                       *)::std::
                         vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                         ::back(&(__return_storage_ptr__->merkle_trees).
                                 super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                               );
            ::std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>::
            emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                      (this_00,(basic_string_view<char,_std::char_traits<char>_> *)local_450);
            bVar22 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                               ((basic_string_view<char,_std::char_traits<char>_> *)local_450,0x20,
                                0xffffffffffffffff);
            sVar21 = bVar22;
          }
          ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)&str._M_str,"verified");
          bdecode_node::dict_find_string
                    ((bdecode_node *)local_4a0,(bdecode_node *)&dh.m_size,stack0xfffffffffffffb50);
          bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_4a0);
          if (bVar2) {
            sVar21 = bdecode_node::string_value((bdecode_node *)local_4a0);
            str._M_len = (size_t)sVar21._M_str;
            local_4c0 = (undefined1  [8])sVar21._M_len;
            if (iVar8 == 1) {
              sVar9 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                                ((basic_string_view<char,_std::char_traits<char>_> *)local_4c0);
              j._4_4_ = (undefined4)sVar9;
              ::std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>::
              emplace_back<int>(&(__return_storage_ptr__->verified_leaf_hashes).
                                 super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                                ,(int *)((long)&j + 4));
              local_4d0 = 0;
              while( true ) {
                uVar1 = local_4d0;
                sVar9 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                                  ((basic_string_view<char,_std::char_traits<char>_> *)local_4c0);
                if (sVar9 <= uVar1) break;
                pvVar13 = ::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                    ((basic_string_view<char,_std::char_traits<char>_> *)local_4c0,
                                     local_4d0);
                if (*pvVar13 == '1') {
                  pvVar14 = ::std::
                            vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>::
                            back(&(__return_storage_ptr__->verified_leaf_hashes).
                                  super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                                );
                  bitfield::set_bit(pvVar14,(int)local_4d0);
                }
                local_4d0 = local_4d0 + 1;
              }
            }
            else {
              local_4d8 = ::std::basic_string_view<char,_std::char_traits<char>_>::data
                                    ((basic_string_view<char,_std::char_traits<char>_> *)local_4c0);
              sVar9 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                                ((basic_string_view<char,_std::char_traits<char>_> *)local_4c0);
              mask._60_4_ = (int)sVar9 << 3;
              ::std::vector<libtorrent::bitfield,std::allocator<libtorrent::bitfield>>::
              emplace_back<char_const*,int>
                        ((vector<libtorrent::bitfield,std::allocator<libtorrent::bitfield>> *)
                         &__return_storage_ptr__->verified_leaf_hashes,&local_4d8,
                         (int *)&mask.field_0x3c);
            }
          }
          bdecode_node::~bdecode_node((bdecode_node *)local_4a0);
          ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)&str_1._M_str,"mask");
          bdecode_node::dict_find_string
                    ((bdecode_node *)local_520,(bdecode_node *)&dh.m_size,stack0xfffffffffffffad0);
          bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_520);
          if (bVar2) {
            sVar21 = bdecode_node::string_value((bdecode_node *)local_520);
            str_1._M_len = (size_t)sVar21._M_str;
            local_540 = (undefined1  [8])sVar21._M_len;
            if (iVar8 == 1) {
              sVar9 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                                ((basic_string_view<char,_std::char_traits<char>_> *)local_540);
              j_1._4_4_ = (undefined4)sVar9;
              ::std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>::
              emplace_back<int>(&(__return_storage_ptr__->merkle_tree_mask).
                                 super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                                ,(int *)((long)&j_1 + 4));
              local_550 = 0;
              while( true ) {
                uVar1 = local_550;
                sVar9 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                                  ((basic_string_view<char,_std::char_traits<char>_> *)local_540);
                if (sVar9 <= uVar1) break;
                pvVar13 = ::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                    ((basic_string_view<char,_std::char_traits<char>_> *)local_540,
                                     local_550);
                if (*pvVar13 == '1') {
                  pvVar14 = ::std::
                            vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>::
                            back(&(__return_storage_ptr__->merkle_tree_mask).
                                  super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                                );
                  bitfield::set_bit(pvVar14,(int)local_550);
                }
                local_550 = local_550 + 1;
              }
            }
            else {
              local_558 = ::std::basic_string_view<char,_std::char_traits<char>_>::data
                                    ((basic_string_view<char,_std::char_traits<char>_> *)local_540);
              sVar9 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                                ((basic_string_view<char,_std::char_traits<char>_> *)local_540);
              local_55c = (int)sVar9 << 3;
              ::std::vector<libtorrent::bitfield,std::allocator<libtorrent::bitfield>>::
              emplace_back<char_const*,int>
                        ((vector<libtorrent::bitfield,std::allocator<libtorrent::bitfield>> *)
                         &__return_storage_ptr__->merkle_tree_mask,&local_558,&local_55c);
            }
          }
          bdecode_node::~bdecode_node((bdecode_node *)local_520);
          alloc._60_4_ = 0;
        }
        else {
LAB_0053a469:
          alloc._60_4_ = 2;
        }
        bdecode_node::~bdecode_node((bdecode_node *)local_420);
      }
      else {
        alloc._60_4_ = 2;
      }
      bdecode_node::~bdecode_node((bdecode_node *)&dh.m_size);
      if (alloc._60_4_ != 0) break;
      de._60_4_ = de._60_4_ + 1;
    }
  }
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_570,"total_uploaded");
  iVar15 = bdecode_node::dict_find_int_value(rd,local_570,0);
  __return_storage_ptr__->total_uploaded = iVar15;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_580,"total_downloaded");
  iVar15 = bdecode_node::dict_find_int_value(rd,local_580,0);
  __return_storage_ptr__->total_downloaded = iVar15;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_590,"active_time");
  iVar15 = bdecode_node::dict_find_int_value(rd,local_590,0);
  __return_storage_ptr__->active_time = (int)iVar15;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_5a0,"finished_time");
  iVar15 = bdecode_node::dict_find_int_value(rd,local_5a0,0);
  __return_storage_ptr__->finished_time = (int)iVar15;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_5b0,"seeding_time");
  iVar15 = bdecode_node::dict_find_int_value(rd,local_5b0,0);
  __return_storage_ptr__->seeding_time = (int)iVar15;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_5c0,"last_seen_complete");
  iVar15 = bdecode_node::dict_find_int_value(rd,local_5c0,0);
  __return_storage_ptr__->last_seen_complete = iVar15;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_5d0,"last_download");
  iVar15 = bdecode_node::dict_find_int_value(rd,local_5d0,0);
  __return_storage_ptr__->last_download = iVar15;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_5e0,"last_upload");
  iVar15 = bdecode_node::dict_find_int_value(rd,local_5e0,0);
  __return_storage_ptr__->last_upload = iVar15;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_5f0,"num_complete");
  iVar15 = bdecode_node::dict_find_int_value(rd,local_5f0,-1);
  __return_storage_ptr__->num_complete = (int)iVar15;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_600,"num_incomplete");
  iVar15 = bdecode_node::dict_find_int_value(rd,local_600,-1);
  __return_storage_ptr__->num_incomplete = (int)iVar15;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_610,"num_downloaded");
  iVar15 = bdecode_node::dict_find_int_value(rd,local_610,-1);
  __return_storage_ptr__->num_downloaded = (int)iVar15;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_620,"max_uploads");
  iVar15 = bdecode_node::dict_find_int_value(rd,local_620,-1);
  __return_storage_ptr__->max_uploads = (int)iVar15;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_630,"max_connections");
  iVar15 = bdecode_node::dict_find_int_value(rd,local_630,-1);
  __return_storage_ptr__->max_connections = (int)iVar15;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_640,"upload_rate_limit");
  iVar15 = bdecode_node::dict_find_int_value(rd,local_640,-1);
  __return_storage_ptr__->upload_limit = (int)iVar15;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_650,"download_rate_limit");
  iVar15 = bdecode_node::dict_find_int_value(rd,local_650,-1);
  __return_storage_ptr__->download_limit = (int)iVar15;
  local_658 = 1;
  anon_unknown_26::apply_flag(&__return_storage_ptr__->flags,rd,"seed_mode",(torrent_flags_t)0x1);
  local_660 = 2;
  anon_unknown_26::apply_flag(&__return_storage_ptr__->flags,rd,"upload_mode",(torrent_flags_t)0x2);
  local_668 = 4;
  anon_unknown_26::apply_flag(&__return_storage_ptr__->flags,rd,"share_mode",(torrent_flags_t)0x4);
  local_670 = 8;
  anon_unknown_26::apply_flag
            (&__return_storage_ptr__->flags,rd,"apply_ip_filter",(torrent_flags_t)0x8);
  local_678 = 0x10;
  anon_unknown_26::apply_flag(&__return_storage_ptr__->flags,rd,"paused",(torrent_flags_t)0x10);
  local_680 = 0x20;
  anon_unknown_26::apply_flag
            (&__return_storage_ptr__->flags,rd,"auto_managed",(torrent_flags_t)0x20);
  local_688 = 0x100;
  anon_unknown_26::apply_flag
            (&__return_storage_ptr__->flags,rd,"super_seeding",(torrent_flags_t)0x100);
  local_690 = 0x1000000;
  anon_unknown_26::apply_flag(&__return_storage_ptr__->flags,rd,"i2p",(torrent_flags_t)0x1000000);
  local_698 = 0x200;
  anon_unknown_26::apply_flag
            (&__return_storage_ptr__->flags,rd,"sequential_download",(torrent_flags_t)0x200);
  local_6a0 = 0x400;
  anon_unknown_26::apply_flag
            (&__return_storage_ptr__->flags,rd,"stop_when_ready",(torrent_flags_t)0x400);
  local_6a8 = 0x80000;
  anon_unknown_26::apply_flag
            (&__return_storage_ptr__->flags,rd,"disable_dht",(torrent_flags_t)0x80000);
  local_6b0 = 0x100000;
  anon_unknown_26::apply_flag
            (&__return_storage_ptr__->flags,rd,"disable_lsd",(torrent_flags_t)0x100000);
  local_6b8 = 0x200000;
  anon_unknown_26::apply_flag
            (&__return_storage_ptr__->flags,rd,"disable_pex",(torrent_flags_t)0x200000);
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_6d8,"save_path")
  ;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&mapped_files.m_size);
  local_6c8 = bdecode_node::dict_find_string_value(rd,local_6d8,stack0xfffffffffffff918);
  ::std::__cxx11::string::operator=((string *)&__return_storage_ptr__->save_path,&local_6c8);
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_738,"mapped_files");
  bdecode_node::dict_find_list((bdecode_node *)local_728,rd,_auStack_738);
  bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_728);
  if (bVar2) {
    new_filename._M_str._4_4_ = 0;
    while( true ) {
      iVar7 = new_filename._M_str._4_4_;
      iVar6 = bdecode_node::list_size((bdecode_node *)local_728);
      iVar5 = new_filename._M_str._4_4_;
      if (iVar6 <= iVar7) break;
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_760);
      sVar21 = bdecode_node::list_string_value_at((bdecode_node *)local_728,iVar5,local_760);
      new_filename._M_len = (size_t)sVar21._M_str;
      local_750 = (undefined1  [8])sVar21._M_len;
      bVar2 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_750);
      if (!bVar2) {
        aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::strong_typedef
                  (&local_764,new_filename._M_str._4_4_);
        this_01 = ::std::
                  map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&(__return_storage_ptr__->renamed_files).
                                super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ,&local_764);
        ::std::__cxx11::string::operator=
                  ((string *)this_01,(basic_string_view<char,_std::char_traits<char>_> *)local_750);
      }
      new_filename._M_str._4_4_ = new_filename._M_str._4_4_ + 1;
    }
  }
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_778,"added_time");
  iVar15 = bdecode_node::dict_find_int_value(rd,local_778,0);
  __return_storage_ptr__->added_time = iVar15;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&file_priority.m_size,
             "completed_time");
  iVar15 = bdecode_node::dict_find_int_value(rd,stack0xfffffffffffff878,0);
  __return_storage_ptr__->completed_time = iVar15;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&i_2,"file_priority");
  bdecode_node::dict_find_list((bdecode_node *)local_7c8,rd,_i_2);
  bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_7c8);
  if (bVar2) {
    idx._4_4_ = bdecode_node::list_size((bdecode_node *)local_7c8);
    uVar17 = aux::numeric_cast<unsigned_long,int,void>(idx._4_4_);
    ::std::
    vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
    ::resize(&__return_storage_ptr__->file_priorities,uVar17,(value_type *)&default_priority);
    for (idx._0_4_ = 0; iVar7 = (int)idx, (int)idx < idx._4_4_; idx._0_4_ = (int)idx + 1) {
      local_7e8 = (size_type)(int)idx;
      bVar3 = aux::strong_typedef::operator_cast_to_unsigned_char
                        ((strong_typedef *)&default_priority);
      iVar15 = bdecode_node::list_int_value_at((bdecode_node *)local_7c8,iVar7,(ulong)bVar3);
      aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>::strong_typedef
                (&local_7e9,(uchar)iVar15);
      psVar16 = ::std::
                clamp<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>
                          (&local_7e9,
                           (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *
                           )&dont_download,
                           (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *
                           )&top_priority);
      pvVar19 = ::std::
                vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                ::operator[](&__return_storage_ptr__->file_priorities,local_7e8);
      pvVar19->m_val = psVar16->m_val;
      pvVar19 = ::std::
                vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                ::operator[](&__return_storage_ptr__->file_priorities,local_7e8);
      bVar2 = aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>::
              operator==(pvVar19,(strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>
                                  *)&dont_download);
      if (bVar2) {
        trackers._56_8_ =
             flags::bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>::operator~
                       ((bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void> *)
                        &torrent_flags::seed_mode);
        flags::bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>::operator&=
                  (&__return_storage_ptr__->flags,
                   (bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)
                   trackers._56_8_);
      }
    }
  }
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_848,"trackers");
  bdecode_node::dict_find_list((bdecode_node *)local_838,rd,local_848);
  bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_838);
  if (bVar2) {
    flags::bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>::operator|=
              (&__return_storage_ptr__->flags,
               (bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)0x800);
    tier_list._60_4_ = 0;
    tier_list.m_size = 0;
    while( true ) {
      iVar7 = tier_list.m_size;
      iVar5 = bdecode_node::list_size((bdecode_node *)local_838);
      if (iVar5 <= iVar7) break;
      bdecode_node::list_at((bdecode_node *)local_898,(bdecode_node *)local_838,tier_list.m_size);
      bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_898);
      if (bVar2) {
        tVar4 = bdecode_node::type((bdecode_node *)local_898);
        if (tVar4 != list_t) goto LAB_0053b80a;
        local_89c = 0;
        while( true ) {
          iVar7 = local_89c;
          iVar6 = bdecode_node::list_size((bdecode_node *)local_898);
          iVar5 = local_89c;
          if (iVar6 <= iVar7) break;
          ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_8c0);
          sVar21 = bdecode_node::list_string_value_at((bdecode_node *)local_898,iVar5,local_8c0);
          local_8b0 = sVar21;
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &__return_storage_ptr__->trackers,&local_8b0);
          ::std::vector<int,_std::allocator<int>_>::push_back
                    (&__return_storage_ptr__->tracker_tiers,
                     (value_type_conflict2 *)&tier_list.field_0x3c);
          url_00 = ::std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::back(&__return_storage_ptr__->trackers);
          bVar2 = aux::is_i2p_url(url_00);
          if (bVar2) {
            url_list.m_size = 0x1000000;
            url_list._60_4_ = 0;
            flags::bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>::operator|=
                      (&__return_storage_ptr__->flags,
                       (bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)0x1000000)
            ;
          }
          local_89c = local_89c + 1;
        }
        tier_list._60_4_ = tier_list._60_4_ + 1;
        alloc._60_4_ = 0;
      }
      else {
LAB_0053b80a:
        alloc._60_4_ = 0x16;
      }
      bdecode_node::~bdecode_node((bdecode_node *)local_898);
      tier_list.m_size = tier_list.m_size + 1;
    }
  }
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_918,"url-list");
  bdecode_node::dict_find_list((bdecode_node *)local_908,rd,local_918);
  bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_908);
  if (bVar2) {
    flags::bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>::operator|=
              (&__return_storage_ptr__->flags,
               (bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)0x1000);
    url._M_str._4_4_ = 0;
    while( true ) {
      iVar7 = url._M_str._4_4_;
      iVar6 = bdecode_node::list_size((bdecode_node *)local_908);
      iVar5 = url._M_str._4_4_;
      if (iVar6 <= iVar7) break;
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&pieces.m_size);
      sVar21 = bdecode_node::list_string_value_at
                         ((bdecode_node *)local_908,iVar5,stack0xfffffffffffff6b8);
      url._M_len = (size_t)sVar21._M_str;
      local_938 = (undefined1  [8])sVar21._M_len;
      bVar2 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_938);
      if (!bVar2) {
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &__return_storage_ptr__->url_seeds,
                   (basic_string_view<char,_std::char_traits<char>_> *)local_938);
      }
      url._M_str._4_4_ = url._M_str._4_4_ + 1;
    }
  }
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&pieces_str,"pieces");
  bdecode_node::dict_find_string((bdecode_node *)local_988,rd,_pieces_str);
  bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_988);
  if (bVar2) {
    if (iVar8 == 1) {
      pcVar20 = bdecode_node::string_ptr((bdecode_node *)local_988);
      i_5.m_val = bdecode_node::string_length((bdecode_node *)local_988);
      bitfield::resize(&(__return_storage_ptr__->have_pieces).super_bitfield,i_5.m_val);
      bitfield::resize(&(__return_storage_ptr__->verified_pieces).super_bitfield,i_5.m_val);
      local_9a5 = 0;
      memset(&local_9ac,0,4);
      while( true ) {
        local_9b0 = typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                    ::end_index(&__return_storage_ptr__->verified_pieces);
        bVar2 = aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator<
                          (&local_9ac,&local_9b0);
        if (!bVar2) break;
        iVar7 = aux::strong_typedef::operator_cast_to_int((strong_typedef *)&local_9ac);
        if ((pcVar20[iVar7] & 1U) == 0) {
          typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
          ::clear_bit(&__return_storage_ptr__->have_pieces,local_9ac);
        }
        else {
          typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
          ::set_bit(&__return_storage_ptr__->have_pieces,local_9ac);
        }
        iVar7 = aux::strong_typedef::operator_cast_to_int((strong_typedef *)&local_9ac);
        if ((pcVar20[iVar7] & 2U) == 0) {
          typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
          ::clear_bit(&__return_storage_ptr__->verified_pieces,local_9ac);
        }
        else {
          typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
          ::set_bit(&__return_storage_ptr__->verified_pieces,local_9ac);
          local_9a5 = 1;
        }
        aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator++(&local_9ac);
      }
      if ((local_9a5 & 1) == 0) {
        bitfield::clear(&(__return_storage_ptr__->verified_pieces).super_bitfield);
      }
    }
    else if (iVar8 == 2) {
      sVar21 = bdecode_node::string_value((bdecode_node *)local_988);
      verified_1._56_8_ = sVar21._M_len;
      pvVar11 = ::std::basic_string_view<char,_std::char_traits<char>_>::data
                          ((basic_string_view<char,_std::char_traits<char>_> *)&verified_1.m_size);
      sVar9 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&verified_1.m_size);
      bitfield::assign(&(__return_storage_ptr__->have_pieces).super_bitfield,pvVar11,(int)sVar9 << 3
                      );
    }
  }
  bdecode_node::~bdecode_node((bdecode_node *)local_988);
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&str_3._M_str,"verified");
  bdecode_node::dict_find_string((bdecode_node *)local_a10,rd,stack0xfffffffffffff5e0);
  bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_a10);
  if (bVar2) {
    sVar21 = bdecode_node::string_value((bdecode_node *)local_a10);
    str_3._M_len = (size_t)sVar21._M_str;
    piece_priority._56_8_ = sVar21._M_len;
    pvVar11 = ::std::basic_string_view<char,_std::char_traits<char>_>::data
                        ((basic_string_view<char,_std::char_traits<char>_> *)&piece_priority.m_size)
    ;
    sVar9 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&piece_priority.m_size);
    bitfield::assign(&(__return_storage_ptr__->verified_pieces).super_bitfield,pvVar11,
                     (int)sVar9 << 3);
  }
  bdecode_node::~bdecode_node((bdecode_node *)local_a10);
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&prio_str,"piece_priority");
  bdecode_node::dict_find_string((bdecode_node *)local_a70,rd,_prio_str);
  bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_a70);
  if (bVar2) {
    i_6 = (size_t)bdecode_node::string_ptr((bdecode_node *)local_a70);
    iVar7 = bdecode_node::string_length((bdecode_node *)local_a70);
    uVar17 = aux::numeric_cast<unsigned_long,int,void>(iVar7);
    ::std::
    vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
    ::resize(&__return_storage_ptr__->piece_priorities,uVar17);
    _v6_size = 0;
    while( true ) {
      uVar1 = _v6_size;
      sVar9 = ::std::
              vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
              ::size(&__return_storage_ptr__->piece_priorities);
      if (sVar9 <= uVar1) break;
      v4_size._2_1_ = *(undefined1 *)(i_6 + _v6_size);
      v4_size._1_1_ =
           aux::strong_typedef::operator_cast_to_unsigned_char((strong_typedef *)&dont_download);
      v4_size._0_1_ =
           aux::strong_typedef::operator_cast_to_unsigned_char((strong_typedef *)&top_priority);
      puVar18 = ::std::clamp<unsigned_char>
                          ((uchar *)((long)&v4_size + 2),(uchar *)((long)&v4_size + 1),
                           (uchar *)&v4_size);
      aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>::strong_typedef
                ((strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *)
                 ((long)&v4_size + 3),*puVar18);
      pvVar19 = ::std::
                vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                ::operator[](&__return_storage_ptr__->piece_priorities,_v6_size);
      pvVar19->m_val = v4_size._3_1_;
      _v6_size = _v6_size + 1;
    }
  }
  bdecode_node::~bdecode_node((bdecode_node *)local_a70);
  peers_entry._60_4_ = 6;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&ptr,"peers");
  bdecode_node::dict_find_string((bdecode_node *)local_ae0,rd,_ptr);
  bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_ae0);
  if (bVar2) {
    pcStack_af8 = bdecode_node::string_ptr((bdecode_node *)local_ae0);
    local_afc = 5;
    while( true ) {
      iVar7 = bdecode_node::string_length((bdecode_node *)local_ae0);
      if (iVar7 <= local_afc) break;
      aux::read_v4_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
                ((basic_endpoint<boost::asio::ip::tcp> *)&peers_entry_1.m_size,
                 (aux *)&stack0xfffffffffffff508,in);
      ::std::
      vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
      ::push_back(&__return_storage_ptr__->peers,(value_type *)&peers_entry_1.m_size);
      local_afc = local_afc + 6;
    }
  }
  bdecode_node::~bdecode_node((bdecode_node *)local_ae0);
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&ptr_1,"peers6");
  bdecode_node::dict_find_string((bdecode_node *)local_b58,rd,_ptr_1);
  bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_b58);
  if (bVar2) {
    pcStack_b70 = bdecode_node::string_ptr((bdecode_node *)local_b58);
    local_b74 = 0x11;
    while( true ) {
      iVar7 = bdecode_node::string_length((bdecode_node *)local_b58);
      if (iVar7 <= local_b74) break;
      aux::read_v6_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
                ((basic_endpoint<boost::asio::ip::tcp> *)&peers_entry_2.m_size,
                 (aux *)&stack0xfffffffffffff490,in_00);
      ::std::
      vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
      ::push_back(&__return_storage_ptr__->peers,(value_type *)&peers_entry_2.m_size);
      local_b74 = local_b74 + 0x12;
    }
  }
  bdecode_node::~bdecode_node((bdecode_node *)local_b58);
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&ptr_2,"banned_peers");
  bdecode_node::dict_find_string((bdecode_node *)local_bd0,rd,_ptr_2);
  bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_bd0);
  if (bVar2) {
    pcStack_be8 = bdecode_node::string_ptr((bdecode_node *)local_bd0);
    local_bec = 6;
    while( true ) {
      iVar7 = bdecode_node::string_length((bdecode_node *)local_bd0);
      if (iVar7 <= local_bec) break;
      aux::read_v4_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
                ((basic_endpoint<boost::asio::ip::tcp> *)&peers_entry_3.m_size,
                 (aux *)&stack0xfffffffffffff418,in_01);
      ::std::
      vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
      ::push_back(&__return_storage_ptr__->banned_peers,(value_type *)&peers_entry_3.m_size);
      local_bec = local_bec + 6;
    }
  }
  bdecode_node::~bdecode_node((bdecode_node *)local_bd0);
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&ptr_3,"banned_peers6");
  bdecode_node::dict_find_string((bdecode_node *)local_c48,rd,_ptr_3);
  bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_c48);
  if (bVar2) {
    pcStack_c60 = bdecode_node::string_ptr((bdecode_node *)local_c48);
    local_c64 = 0x11;
    while( true ) {
      iVar7 = bdecode_node::string_length((bdecode_node *)local_c48);
      if (iVar7 <= local_c64) break;
      aux::read_v6_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
                ((basic_endpoint<boost::asio::ip::tcp> *)&unfinished_entry.m_size,
                 (aux *)&stack0xfffffffffffff3a0,in_02);
      ::std::
      vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
      ::push_back(&__return_storage_ptr__->banned_peers,(value_type *)&unfinished_entry.m_size);
      local_c64 = local_c64 + 0x12;
    }
  }
  bdecode_node::~bdecode_node((bdecode_node *)local_c48);
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_cd0,"unfinished");
  bdecode_node::dict_find_list((bdecode_node *)local_cc0,rd,_auStack_cd0);
  bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_cc0);
  if (bVar2) {
    e._60_4_ = 0;
    while( true ) {
      iVar7 = bdecode_node::list_size((bdecode_node *)local_cc0);
      if (iVar7 <= (int)e._60_4_) break;
      bdecode_node::list_at((bdecode_node *)local_d18,(bdecode_node *)local_cc0,e._60_4_);
      tVar4 = bdecode_node::type((bdecode_node *)local_d18);
      if (tVar4 == dict_t) {
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_d30,"piece");
        iVar8 = bdecode_node::dict_find_int_value((bdecode_node *)local_d18,local_d30,-1);
        aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef
                  (&local_d1c,(int)iVar8);
        aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef
                  ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                   &bitmask.field_0x3c,0);
        bVar2 = aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator<
                          (&local_d1c,
                           (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                           &bitmask.field_0x3c);
        if (bVar2) {
          alloc._60_4_ = 0x31;
        }
        else {
          ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_d88,"bitmask");
          bdecode_node::dict_find_string
                    ((bdecode_node *)local_d78,(bdecode_node *)local_d18,local_d88);
          bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_d78);
          if (bVar2) {
            iVar7 = bdecode_node::string_length((bdecode_node *)local_d78);
            if (iVar7 == 0) goto LAB_0053c8a8;
            this_02 = ::std::
                      map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>
                      ::operator[](&(__return_storage_ptr__->unfinished_pieces).
                                    super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>
                                   ,&local_d1c);
            pcVar20 = bdecode_node::string_ptr((bdecode_node *)local_d78);
            iVar7 = bdecode_node::string_length((bdecode_node *)local_d78);
            bitfield::assign(this_02,pcVar20,iVar7 << 3);
            alloc._60_4_ = 0;
          }
          else {
LAB_0053c8a8:
            alloc._60_4_ = 0x31;
          }
          bdecode_node::~bdecode_node((bdecode_node *)local_d78);
        }
      }
      else {
        alloc._60_4_ = 0x31;
      }
      bdecode_node::~bdecode_node((bdecode_node *)local_d18);
      e._60_4_ = e._60_4_ + 1;
    }
  }
  bdecode_node::~bdecode_node((bdecode_node *)local_cc0);
  f = flags::bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>::operator~
                ((bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void> *)
                 &torrent_flags::need_save_resume);
  flags::bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>::operator&=
            (&__return_storage_ptr__->flags,f);
  alloc._60_4_ = 1;
  bdecode_node::~bdecode_node((bdecode_node *)local_908);
  bdecode_node::~bdecode_node((bdecode_node *)local_838);
  bdecode_node::~bdecode_node((bdecode_node *)local_7c8);
  bdecode_node::~bdecode_node((bdecode_node *)local_728);
  bdecode_node::~bdecode_node((bdecode_node *)local_388);
  bdecode_node::~bdecode_node((bdecode_node *)local_1f8);
  return __return_storage_ptr__;
}

Assistant:

add_torrent_params read_resume_data(bdecode_node const& rd, error_code& ec
		, int const piece_limit)
	{
		add_torrent_params ret;
		if (rd.type() != bdecode_node::dict_t)
		{
			ec = errors::not_a_dictionary;
			return ret;
		}

		if (bdecode_node const alloc = rd.dict_find_string("allocation"))
		{
			ret.storage_mode = (alloc.string_value() == "allocate"
				|| alloc.string_value() == "full")
				? storage_mode_allocate : storage_mode_sparse;
		}

		if (rd.dict_find_string_value("file-format")
			!= "libtorrent resume file")
		{
			ec = errors::invalid_file_tag;
			return ret;
		}

		std::int64_t const file_version = rd.dict_find_int_value("file-version", 1);

		if (file_version != 1 && file_version != 2)
		{
			ec = errors::invalid_file_tag;
			return ret;
		}

		auto info_hash = rd.dict_find_string_value("info-hash");
		auto info_hash2 = rd.dict_find_string_value("info-hash2");
		if (info_hash.size() != std::size_t(sha1_hash::size())
			&& info_hash2.size() != std::size_t(sha256_hash::size()))
		{
			ec = errors::missing_info_hash;
			return ret;
		}

		ret.name = rd.dict_find_string_value("name");

		if (info_hash.size() == 20)
			ret.info_hashes.v1.assign(info_hash.data());
		if (info_hash2.size() == 32)
			ret.info_hashes.v2.assign(info_hash2.data());

		bdecode_node const info = rd.dict_find_dict("info");
		if (info)
		{
			// verify the info-hash of the metadata stored in the resume file matches
			// the torrent we're loading
			info_hash_t const resume_ih(hasher(info.data_section()).final()
				, hasher256(info.data_section()).final());

			// if url is set, the info_hash is not actually the info-hash of the
			// torrent, but the hash of the URL, until we have the full torrent
			// only require the info-hash to match if we actually passed in one
			if ((!ret.info_hashes.has_v1() || resume_ih.v1 == ret.info_hashes.v1)
				&& (!ret.info_hashes.has_v2() || resume_ih.v2 == ret.info_hashes.v2))
			{
				auto ti = std::make_shared<torrent_info>(resume_ih);

				error_code err;
				if (!ti->parse_info_section(info, err, piece_limit))
				{
					ec = err;
				}
				else
				{
					// time_t might be 32 bit if we're unlucky, but there isn't
					// much to do about it
					ti->internal_set_creation_date(static_cast<std::time_t>(
						rd.dict_find_int_value("creation date", 0)));
					ti->internal_set_creator(rd.dict_find_string_value("created by", ""));
					ti->internal_set_comment(rd.dict_find_string_value("comment", ""));
				}
				ret.ti = std::move(ti);
			}
			else
			{
				ec = errors::mismatching_info_hash;
			}
		}

#if TORRENT_ABI_VERSION < 3
		ret.info_hash = ret.info_hashes.get_best();
#endif

		bdecode_node const trees = rd.dict_find_list("trees");
		if (trees)
		{
			ret.merkle_trees.reserve(trees.list_size());
			ret.verified_leaf_hashes.reserve(trees.list_size());
			for (int i = 0; i < trees.list_size(); ++i)
			{
				auto de = trees.list_at(i);
				if (de.type() != bdecode_node::dict_t)
					break;
				auto dh = de.dict_find_string("hashes");
				if (!dh || dh.string_length() % 32 != 0) break;

				ret.merkle_trees.emplace_back();
				ret.merkle_trees.back().reserve(dh.string_value().size() / 32);
				for (auto hashes = dh.string_value();
					!hashes.empty(); hashes = hashes.substr(32))
				{
					ret.merkle_trees.back().emplace_back(hashes);
				}

				if (bdecode_node const verified = de.dict_find_string("verified"))
				{
					string_view const str = verified.string_value();
					if (file_version == 1)
					{
						ret.verified_leaf_hashes.emplace_back(int(str.size()));
						for (std::size_t j = 0; j < str.size(); ++j)
						{
							if (str[j] == '1')
								ret.verified_leaf_hashes.back().set_bit(int(j));
						}
					}
					else
					{
						ret.verified_leaf_hashes.emplace_back(str.data(), int(str.size()) * 8);
					}
				}

				if (bdecode_node const mask = de.dict_find_string("mask"))
				{
					string_view const str = mask.string_value();
					if (file_version == 1)
					{
						ret.merkle_tree_mask.emplace_back(int(str.size()));
						for (std::size_t j = 0; j < str.size(); ++j)
						{
							if (str[j] == '1')
								ret.merkle_tree_mask.back().set_bit(int(j));
						}
					}
					else
					{
						ret.merkle_tree_mask.emplace_back(str.data(), int(str.size()) * 8);
					}
				}
			}
		}

		ret.total_uploaded = rd.dict_find_int_value("total_uploaded");
		ret.total_downloaded = rd.dict_find_int_value("total_downloaded");

		ret.active_time = int(rd.dict_find_int_value("active_time"));
		ret.finished_time = int(rd.dict_find_int_value("finished_time"));
		ret.seeding_time = int(rd.dict_find_int_value("seeding_time"));

		ret.last_seen_complete = std::time_t(rd.dict_find_int_value("last_seen_complete"));

		ret.last_download = std::time_t(rd.dict_find_int_value("last_download", 0));
		ret.last_upload = std::time_t(rd.dict_find_int_value("last_upload", 0));

		// scrape data cache
		ret.num_complete = int(rd.dict_find_int_value("num_complete", -1));
		ret.num_incomplete = int(rd.dict_find_int_value("num_incomplete", -1));
		ret.num_downloaded = int(rd.dict_find_int_value("num_downloaded", -1));

		// torrent settings
		ret.max_uploads = int(rd.dict_find_int_value("max_uploads", -1));
		ret.max_connections = int(rd.dict_find_int_value("max_connections", -1));
		ret.upload_limit = int(rd.dict_find_int_value("upload_rate_limit", -1));
		ret.download_limit = int(rd.dict_find_int_value("download_rate_limit", -1));

		// torrent flags
		apply_flag(ret.flags, rd, "seed_mode", torrent_flags::seed_mode);
		apply_flag(ret.flags, rd, "upload_mode", torrent_flags::upload_mode);
#ifndef TORRENT_DISABLE_SHARE_MODE
		apply_flag(ret.flags, rd, "share_mode", torrent_flags::share_mode);
#endif
		apply_flag(ret.flags, rd, "apply_ip_filter", torrent_flags::apply_ip_filter);
		apply_flag(ret.flags, rd, "paused", torrent_flags::paused);
		apply_flag(ret.flags, rd, "auto_managed", torrent_flags::auto_managed);
#ifndef TORRENT_DISABLE_SUPERSEEDING
		apply_flag(ret.flags, rd, "super_seeding", torrent_flags::super_seeding);
#endif
#if TORRENT_USE_I2P
		apply_flag(ret.flags, rd, "i2p", torrent_flags::i2p_torrent);
#endif
		apply_flag(ret.flags, rd, "sequential_download", torrent_flags::sequential_download);
		apply_flag(ret.flags, rd, "stop_when_ready", torrent_flags::stop_when_ready);
		apply_flag(ret.flags, rd, "disable_dht", torrent_flags::disable_dht);
		apply_flag(ret.flags, rd, "disable_lsd", torrent_flags::disable_lsd);
		apply_flag(ret.flags, rd, "disable_pex", torrent_flags::disable_pex);

		ret.save_path = rd.dict_find_string_value("save_path");

#if TORRENT_ABI_VERSION == 1
		// deprecated in 1.2
		ret.url = rd.dict_find_string_value("url");
#endif

		bdecode_node const mapped_files = rd.dict_find_list("mapped_files");
		if (mapped_files)
		{
			for (int i = 0; i < mapped_files.list_size(); ++i)
			{
				auto new_filename = mapped_files.list_string_value_at(i);
				if (new_filename.empty()) continue;
				ret.renamed_files[file_index_t(i)] = new_filename;
			}
		}

		ret.added_time = std::time_t(rd.dict_find_int_value("added_time", 0));
		ret.completed_time = std::time_t(rd.dict_find_int_value("completed_time", 0));

		// load file priorities except if the add_torrent_param file was set to
		// override resume data
		bdecode_node const file_priority = rd.dict_find_list("file_priority");
		if (file_priority)
		{
			int const num_files = file_priority.list_size();
			ret.file_priorities.resize(aux::numeric_cast<std::size_t>(num_files)
				, default_priority);
			for (int i = 0; i < num_files; ++i)
			{
				auto const idx = static_cast<std::size_t>(i);
				ret.file_priorities[idx] = std::clamp(
					download_priority_t(static_cast<std::uint8_t>(
						file_priority.list_int_value_at(i
							, static_cast<std::uint8_t>(default_priority))))
						, dont_download, top_priority);
				// this is suspicious, leave seed mode
				if (ret.file_priorities[idx] == dont_download)
				{
					ret.flags &= ~torrent_flags::seed_mode;
				}
			}
		}

		bdecode_node const trackers = rd.dict_find_list("trackers");
		if (trackers)
		{
			// it's possible to delete the trackers from a torrent and then save
			// resume data with an empty trackers list. Since we found a trackers
			// list here, these should replace whatever we find in the .torrent
			// file.
			ret.flags |= torrent_flags::deprecated_override_trackers;

			int tier = 0;
			for (int i = 0; i < trackers.list_size(); ++i)
			{
				bdecode_node const tier_list = trackers.list_at(i);
				if (!tier_list || tier_list.type() != bdecode_node::list_t)
					continue;

				for (int j = 0; j < tier_list.list_size(); ++j)
				{
					ret.trackers.emplace_back(tier_list.list_string_value_at(j));
					ret.tracker_tiers.push_back(tier);
#if TORRENT_USE_I2P
					if (aux::is_i2p_url(ret.trackers.back())) ret.flags |= torrent_flags::i2p_torrent;
#endif
				}
				++tier;
			}
		}

		// if merge resume http seeds is not set, we need to clear whatever web
		// seeds we loaded from the .torrent file, because we want whatever's in
		// the resume file to take precedence. If there aren't even any fields in
		// the resume data though, keep the ones from the torrent
		bdecode_node const url_list = rd.dict_find_list("url-list");
		if (url_list)
		{
			// since we found http seeds in the resume data, they should replace
			// whatever web seeds are specified in the .torrent, by default
			ret.flags |= torrent_flags::deprecated_override_web_seeds;
			for (int i = 0; i < url_list.list_size(); ++i)
			{
				auto url = url_list.list_string_value_at(i);
				if (url.empty()) continue;
				ret.url_seeds.emplace_back(url);
			}
		}

		// some sanity checking. Maybe we shouldn't be in seed mode anymore
		if (bdecode_node const pieces = rd.dict_find_string("pieces"))
		{
			if (file_version == 1)
			{
				char const* pieces_str = pieces.string_ptr();
				int const pieces_len = pieces.string_length();
				ret.have_pieces.resize(pieces_len);
				ret.verified_pieces.resize(pieces_len);
				bool any_verified = false;
				for (piece_index_t i(0); i < ret.verified_pieces.end_index(); ++i)
				{
					// being in seed mode and missing a piece is not compatible.
					// Leave seed mode if that happens
					if (pieces_str[static_cast<int>(i)] & 1) ret.have_pieces.set_bit(i);
					else ret.have_pieces.clear_bit(i);

					if (pieces_str[static_cast<int>(i)] & 2)
					{
						ret.verified_pieces.set_bit(i);
						any_verified = true;
					}
					else
					{
						ret.verified_pieces.clear_bit(i);
					}
				}
				if (!any_verified) ret.verified_pieces.clear();
			}
			else if (file_version == 2)
			{
				string_view const str = pieces.string_value();
				ret.have_pieces.assign(str.data(), int(str.size()) * 8);
			}
		}

		if (bdecode_node const verified = rd.dict_find_string("verified"))
		{
			string_view const str = verified.string_value();
			ret.verified_pieces.assign(str.data(), int(str.size()) * 8);
		}

		if (bdecode_node const piece_priority = rd.dict_find_string("piece_priority"))
		{
			char const* prio_str = piece_priority.string_ptr();
			ret.piece_priorities.resize(aux::numeric_cast<std::size_t>(piece_priority.string_length()));
			for (std::size_t i = 0; i < ret.piece_priorities.size(); ++i)
			{
				ret.piece_priorities[i] = download_priority_t(std::clamp(
					static_cast<std::uint8_t>(prio_str[i])
					, static_cast<std::uint8_t>(dont_download)
					, static_cast<std::uint8_t>(top_priority)));
			}
		}

		int const v6_size = 18;
		int const v4_size = 6;
		using namespace libtorrent::aux; // for read_*_endpoint()
		if (bdecode_node const peers_entry = rd.dict_find_string("peers"))
		{
			char const* ptr = peers_entry.string_ptr();
			for (int i = v4_size - 1; i < peers_entry.string_length(); i += v4_size)
				ret.peers.push_back(read_v4_endpoint<tcp::endpoint>(ptr));
		}

		if (bdecode_node const peers_entry = rd.dict_find_string("peers6"))
		{
			char const* ptr = peers_entry.string_ptr();
			for (int i = v6_size - 1; i < peers_entry.string_length(); i += v6_size)
				ret.peers.push_back(read_v6_endpoint<tcp::endpoint>(ptr));
		}

		if (bdecode_node const peers_entry = rd.dict_find_string("banned_peers"))
		{
			char const* ptr = peers_entry.string_ptr();
			for (int i = v4_size; i < peers_entry.string_length(); i += v4_size)
				ret.banned_peers.push_back(read_v4_endpoint<tcp::endpoint>(ptr));
		}

		if (bdecode_node const peers_entry = rd.dict_find_string("banned_peers6"))
		{
			char const* ptr = peers_entry.string_ptr();
			for (int i = v6_size - 1; i < peers_entry.string_length(); i += v6_size)
				ret.banned_peers.push_back(read_v6_endpoint<tcp::endpoint>(ptr));
		}

		// parse unfinished pieces
		if (bdecode_node const unfinished_entry = rd.dict_find_list("unfinished"))
		{
			for (int i = 0; i < unfinished_entry.list_size(); ++i)
			{
				bdecode_node const e = unfinished_entry.list_at(i);
				if (e.type() != bdecode_node::dict_t) continue;
				piece_index_t const piece = piece_index_t(int(e.dict_find_int_value("piece", -1)));
				if (piece < piece_index_t(0)) continue;

				bdecode_node const bitmask = e.dict_find_string("bitmask");
				if (!bitmask || bitmask.string_length() == 0) continue;
				ret.unfinished_pieces[piece].assign(
					bitmask.string_ptr(), bitmask.string_length() * CHAR_BIT);
			}
		}

		// we're loading this torrent from resume data. There's no need to
		// re-save the resume data immediately.
		ret.flags &= ~torrent_flags::need_save_resume;

		return ret;
	}